

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

string * __thiscall
cmMakefile::GetModulesFile_abi_cxx11_
          (string *__return_storage_ptr__,cmMakefile *this,char *filename)

{
  char *pcVar1;
  pointer pcVar2;
  cmMakefile *this_00;
  bool bVar3;
  PolicyStatus PVar4;
  char *pcVar5;
  size_t sVar6;
  string *psVar7;
  ostream *poVar8;
  PolicyID id;
  pointer pbVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modulePath;
  string moduleInCMakeRoot;
  string moduleInCMakeModulePath;
  string itempl;
  undefined1 auStack_268 [8];
  string *local_260;
  undefined1 local_258 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  cmMakefile *local_218;
  string local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  char *local_1e8;
  long local_1e0;
  char local_1d8;
  undefined7 uStack_1d7;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1f0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_238._M_allocated_capacity = (size_type)&local_228;
  local_238._8_8_ = (char *)0x0;
  local_228._M_local_buf[0] = '\0';
  local_1e8 = &local_1d8;
  local_1e0 = 0;
  local_1d8 = '\0';
  pcVar1 = local_1a8 + 0x10;
  local_260 = __return_storage_ptr__;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_MODULE_PATH","");
  local_218 = this;
  pcVar5 = GetDefinition(this,(string *)local_1a8);
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar5 != (char *)0x0) {
    local_258._0_8_ = (pointer)0x0;
    local_258._8_8_ = (pointer)0x0;
    local_258._16_8_ = (pointer)0x0;
    local_1a8._0_8_ = pcVar1;
    sVar6 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar5,pcVar5 + sVar6);
    cmSystemTools::ExpandListArgument
              ((string *)local_1a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_258,false);
    if ((char *)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (local_258._0_8_ != local_258._8_8_) {
      pbVar9 = (pointer)local_258._0_8_;
      do {
        while( true ) {
          pcVar2 = (pbVar9->_M_dataplus)._M_p;
          local_1a8._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pcVar2,pcVar2 + pbVar9->_M_string_length);
          cmsys::SystemTools::ConvertToUnixSlashes((string *)local_1a8);
          std::__cxx11::string::append((char *)local_1a8);
          std::__cxx11::string::append((char *)local_1a8);
          bVar3 = cmsys::SystemTools::FileExists((char *)local_1a8._0_8_);
          if (!bVar3) break;
          std::__cxx11::string::_M_assign((string *)&local_1e8);
          if ((char *)local_1a8._0_8_ != pcVar1) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          pbVar9 = pbVar9 + 1;
          if (bVar3 || pbVar9 == (pointer)local_258._8_8_) goto LAB_002ea0c7;
        }
        if ((char *)local_1a8._0_8_ != pcVar1) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != (pointer)local_258._8_8_);
    }
LAB_002ea0c7:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_258);
  }
  cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)local_238._M_local_buf);
  std::__cxx11::string::append(local_238._M_local_buf);
  std::__cxx11::string::append(local_238._M_local_buf);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)&local_238);
  bVar3 = cmsys::SystemTools::FileExists((char *)local_238._M_allocated_capacity);
  if (!bVar3) {
    std::__cxx11::string::_M_replace((ulong)&local_238,0,(char *)local_238._8_8_,0x5f2b3e);
  }
  std::__cxx11::string::_M_assign((string *)local_260);
  if (local_260->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)local_260);
  }
  if ((local_1e0 == 0) || ((char *)local_238._8_8_ == (char *)0x0)) goto LAB_002ea452;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_CURRENT_LIST_FILE","");
  pcVar5 = GetDefinition(local_218,(string *)local_1a8);
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  psVar7 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  local_258._0_8_ = local_258 + 0x10;
  pcVar2 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_258,pcVar2,pcVar2 + psVar7->_M_string_length);
  std::__cxx11::string::append(local_258);
  if (pcVar5 == (char *)0x0) {
    bVar3 = false;
  }
  else {
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    sVar6 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,pcVar5,pcVar5 + sVar6);
    bVar3 = cmsys::SystemTools::IsSubDirectory(&local_1c8,(string *)local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar3 != false) {
    PVar4 = cmStateSnapshot::GetPolicy(&local_218->StateSnapshot,CMP0017);
    if ((2 < PVar4 - NEW) && (PVar4 != OLD)) {
      if (PVar4 != WARN) goto LAB_002ea436;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"File ",5);
      this_00 = local_218;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)auStack_268 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0xc0);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," includes ",10);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1e8,local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8," (found via CMAKE_MODULE_PATH) which shadows ",0x2d);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(char *)local_238._M_allocated_capacity,local_238._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,". This may cause errors later on .\n",0x23);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_210,(cmPolicies *)0x11,id);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,local_210._M_dataplus._M_p,local_210._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      IssueMessage(this_00,AUTHOR_WARNING,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    std::__cxx11::string::_M_assign((string *)local_260);
  }
LAB_002ea436:
  if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
    operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
  }
LAB_002ea452:
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_allocated_capacity != &local_228) {
    operator_delete((void *)local_238._M_allocated_capacity,
                    CONCAT71(local_228._M_allocated_capacity._1_7_,local_228._M_local_buf[0]) + 1);
  }
  return local_260;
}

Assistant:

std::string cmMakefile::GetModulesFile(const char* filename) const
{
  std::string result;

  // We search the module always in CMAKE_ROOT and in CMAKE_MODULE_PATH,
  // and then decide based on the policy setting which one to return.
  // See CMP0017 for more details.
  // The specific problem was that KDE 4.5.0 installs a
  // FindPackageHandleStandardArgs.cmake which doesn't have the new features
  // of FPHSA.cmake introduced in CMake 2.8.3 yet, and by setting
  // CMAKE_MODULE_PATH also e.g. FindZLIB.cmake from cmake included
  // FPHSA.cmake from kdelibs and not from CMake, and tried to use the
  // new features, which were not there in the version from kdelibs, and so
  // failed ("
  std::string moduleInCMakeRoot;
  std::string moduleInCMakeModulePath;

  // Always search in CMAKE_MODULE_PATH:
  const char* cmakeModulePath = this->GetDefinition("CMAKE_MODULE_PATH");
  if (cmakeModulePath) {
    std::vector<std::string> modulePath;
    cmSystemTools::ExpandListArgument(cmakeModulePath, modulePath);

    // Look through the possible module directories.
    for (std::vector<std::string>::iterator i = modulePath.begin();
         i != modulePath.end(); ++i) {
      std::string itempl = *i;
      cmSystemTools::ConvertToUnixSlashes(itempl);
      itempl += "/";
      itempl += filename;
      if (cmSystemTools::FileExists(itempl.c_str())) {
        moduleInCMakeModulePath = itempl;
        break;
      }
    }
  }

  // Always search in the standard modules location.
  moduleInCMakeRoot = cmSystemTools::GetCMakeRoot();
  moduleInCMakeRoot += "/Modules/";
  moduleInCMakeRoot += filename;
  cmSystemTools::ConvertToUnixSlashes(moduleInCMakeRoot);
  if (!cmSystemTools::FileExists(moduleInCMakeRoot.c_str())) {
    moduleInCMakeRoot = "";
  }

  // Normally, prefer the files found in CMAKE_MODULE_PATH. Only when the file
  // from which we are being called is located itself in CMAKE_ROOT, then
  // prefer results from CMAKE_ROOT depending on the policy setting.
  result = moduleInCMakeModulePath;
  if (result.empty()) {
    result = moduleInCMakeRoot;
  }

  if (!moduleInCMakeModulePath.empty() && !moduleInCMakeRoot.empty()) {
    const char* currentFile = this->GetDefinition("CMAKE_CURRENT_LIST_FILE");
    std::string mods = cmSystemTools::GetCMakeRoot() + "/Modules/";
    if (currentFile && cmSystemTools::IsSubDirectory(currentFile, mods)) {
      switch (this->GetPolicyStatus(cmPolicies::CMP0017)) {
        case cmPolicies::WARN: {
          std::ostringstream e;
          /* clang-format off */
          e << "File " << currentFile << " includes "
            << moduleInCMakeModulePath
            << " (found via CMAKE_MODULE_PATH) which shadows "
            << moduleInCMakeRoot  << ". This may cause errors later on .\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0017);
          /* clang-format on */

          this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
          CM_FALLTHROUGH;
        }
        case cmPolicies::OLD:
          result = moduleInCMakeModulePath;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          result = moduleInCMakeRoot;
          break;
      }
    }
  }

  return result;
}